

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O0

void cmUVPipeBuffer::UVData(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  cmUVPipeBuffer *this;
  long local_80;
  undefined1 local_58 [8];
  EndFunction efunc;
  cmUVPipeBuffer *pipe;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_stream_t *stream_local;
  
  this = (cmUVPipeBuffer *)stream->data;
  if (nread < 1) {
    if (nread < 0) {
      std::function<void_(long)>::function((function<void_(long)> *)local_58);
      std::function<void_(long)>::swap((function<void_(long)> *)local_58,&this->EndFunction_);
      reset(this);
      local_80 = nread;
      if (nread == -0xfff) {
        local_80 = 0;
      }
      std::function<void_(long)>::operator()((function<void_(long)> *)local_58,local_80);
      std::function<void_(long)>::~function((function<void_(long)> *)local_58);
    }
  }
  else if (buf->base != (char *)0x0) {
    cmRange<const_char_*>::cmRange
              ((cmRange<const_char_*> *)&efunc._M_invoker,buf->base,buf->base + nread);
    std::function<void_(cmRange<const_char_*>)>::operator()
              (&this->DataFunction_,stack0xffffffffffffffc8);
  }
  return;
}

Assistant:

void cmUVPipeBuffer::UVData(uv_stream_t* stream, ssize_t nread,
                            const uv_buf_t* buf)
{
  auto& pipe = *reinterpret_cast<cmUVPipeBuffer*>(stream->data);
  if (nread > 0) {
    if (buf->base != nullptr) {
      // Call data function
      pipe.DataFunction_(DataRange(buf->base, buf->base + nread));
    }
  } else if (nread < 0) {
    // Save the end function on the stack before resetting the pipe
    EndFunction efunc;
    efunc.swap(pipe.EndFunction_);
    // Reset pipe before calling the end function
    pipe.reset();
    // Call end function
    efunc((nread == UV_EOF) ? 0 : nread);
  }
}